

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  cmake *pcVar7;
  uint uVar8;
  ulong uVar9;
  cmExecutionStatus status;
  MessageType messType;
  cmExecutionStatus *local_188;
  cmMakefile *local_180;
  string errorString;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileContext conditionContext;
  cmListFileBacktrace bt;
  string err;
  cmConditionEvaluator conditionEvaluator;
  
  iVar4 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"if");
  if (iVar4 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
LAB_003567c8:
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
              (&this->Functions,lff);
  }
  else {
    iVar4 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif")
    ;
    if (iVar4 != 0) goto LAB_003567c8;
    puVar1 = &this->ScopeDepth;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) goto LAB_003567c8;
    cmMakefile::RemoveFunctionBlocker
              ((cmMakefile *)&conditionEvaluator,(cmFunctionBlocker *)mf,(cmListFileFunction *)this)
    ;
    iVar4 = 0;
    if (conditionEvaluator.Makefile == (cmMakefile *)0x0) goto LAB_003567da;
    local_180 = conditionEvaluator.Makefile;
    status.ReturnInvoked = false;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    uVar8 = 0;
    local_188 = inStatus;
    while( true ) {
      uVar9 = (ulong)uVar8;
      pcVar2 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2 >> 6) <= uVar9)
      break;
      iVar5 = cmsys::SystemTools::Strucmp
                        (pcVar2[uVar9].super_cmCommandContext.Name._M_dataplus._M_p,"if");
      iVar6 = cmsys::SystemTools::Strucmp
                        ((this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext.
                         Name._M_dataplus._M_p,"endif");
      iVar4 = (iVar4 + (uint)(iVar5 == 0)) - (uint)(iVar6 == 0);
      if (iVar4 == 0) {
        iVar5 = cmsys::SystemTools::Strucmp
                          ((this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext.
                           Name._M_dataplus._M_p,"else");
        if (iVar5 == 0) {
          if (this->ElseSeen == true) {
            cmMakefile::GetBacktrace
                      ((cmListFileBacktrace *)&conditionEvaluator,mf,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext);
            pcVar7 = cmMakefile::GetCMakeInstance(mf);
            std::__cxx11::string::string
                      ((string *)&conditionContext,
                       "A duplicate ELSE command was found inside an IF block.",
                       (allocator *)&errorString);
            cmake::IssueMessage(pcVar7,FATAL_ERROR,&conditionContext.Name,
                                (cmListFileBacktrace *)&conditionEvaluator);
LAB_003568c4:
            std::__cxx11::string::~string((string *)&conditionContext);
            cmSystemTools::s_FatalErrorOccured = true;
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&conditionEvaluator);
            break;
          }
          bVar3 = this->HasRun;
          this->IsBlocking = bVar3;
          this->HasRun = true;
          this->ElseSeen = true;
          if (bVar3 == false) {
            pcVar7 = cmMakefile::GetCMakeInstance(mf);
            if (pcVar7->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (mf,(this->Functions).
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar9);
            }
          }
        }
        else {
          iVar5 = cmsys::SystemTools::Strucmp
                            ((this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext
                             .Name._M_dataplus._M_p,"elseif");
          if (iVar5 != 0) goto LAB_0035652f;
          if (this->ElseSeen == true) {
            cmMakefile::GetBacktrace
                      ((cmListFileBacktrace *)&conditionEvaluator,mf,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext);
            pcVar7 = cmMakefile::GetCMakeInstance(mf);
            std::__cxx11::string::string
                      ((string *)&conditionContext,
                       "An ELSEIF command was found after an ELSE command.",
                       (allocator *)&errorString);
            cmake::IssueMessage(pcVar7,FATAL_ERROR,&conditionContext.Name,
                                (cmListFileBacktrace *)&conditionEvaluator);
            goto LAB_003568c4;
          }
          if (this->HasRun == true) {
            this->IsBlocking = true;
          }
          else {
            pcVar7 = cmMakefile::GetCMakeInstance(mf);
            if (pcVar7->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (mf,(this->Functions).
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar9);
            }
            errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
            errorString._M_string_length = 0;
            expandedArguments.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            errorString.field_2._M_local_buf[0] = '\0';
            expandedArguments.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            expandedArguments.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmMakefile::ExpandArguments
                      (mf,&(this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar9].Arguments,
                       &expandedArguments,(char *)0x0);
            cmListFileContext::FromCommandContext
                      (&conditionContext,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext,
                       &(this->super_cmFunctionBlocker).StartingContext.FilePath);
            cmMakefile::GetBacktrace
                      ((cmListFileBacktrace *)&err,mf,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9].super_cmCommandContext);
            cmConditionEvaluator::cmConditionEvaluator
                      (&conditionEvaluator,mf,&conditionContext,(cmListFileBacktrace *)&err);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&err);
            bVar3 = cmConditionEvaluator::IsTrue
                              (&conditionEvaluator,&expandedArguments,&errorString,&messType);
            if (errorString._M_string_length != 0) {
              cmIfCommandError_abi_cxx11_(&err,&expandedArguments);
              std::__cxx11::string::append((string *)&err);
              cmMakefile::GetBacktrace
                        (&bt,mf,&(this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                 super_cmCommandContext);
              pcVar7 = cmMakefile::GetCMakeInstance(mf);
              cmake::IssueMessage(pcVar7,messType,&err,&bt);
              if (messType == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccured = true;
                cmListFileBacktrace::~cmListFileBacktrace(&bt);
                std::__cxx11::string::~string((string *)&err);
                cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
                cmListFileContext::~cmListFileContext(&conditionContext);
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector(&expandedArguments);
                std::__cxx11::string::~string((string *)&errorString);
                break;
              }
              cmListFileBacktrace::~cmListFileBacktrace(&bt);
              std::__cxx11::string::~string((string *)&err);
            }
            if (bVar3) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
            cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
            cmListFileContext::~cmListFileContext(&conditionContext);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&expandedArguments);
            std::__cxx11::string::~string((string *)&errorString);
          }
        }
      }
      else {
LAB_0035652f:
        if (this->IsBlocking == false) {
          status.ReturnInvoked = false;
          status.BreakInvoked = false;
          status.ContinueInvoked = false;
          status.NestedError = false;
          cmMakefile::ExecuteCommand
                    (mf,(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar9,&status);
          if (status.ReturnInvoked == true) {
            local_188->ReturnInvoked = true;
            break;
          }
          if (status.BreakInvoked == true) {
            local_188->BreakInvoked = true;
            break;
          }
          if (status.ContinueInvoked == true) {
            local_188->ContinueInvoked = true;
            break;
          }
        }
      }
      uVar8 = uVar8 + 1;
    }
    (*(code *)(local_180->FindPackageModuleStack).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map[3])();
  }
  iVar4 = 1;
LAB_003567da:
  return SUB41(iVar4,0);
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "if")) {
    this->ScopeDepth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endif")) {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (unsigned int c = 0; c < this->Functions.size(); ++c) {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "if")) {
          scopeDepth++;
        }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                    "endif")) {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "else")) {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(this->Functions[c]);
          }
        } else if (scopeDepth == 0 &&
                   !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                           "elseif")) {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(this->Functions[c]);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                this->Functions[c], this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(
              mf, conditionContext, mf.GetBacktrace(this->Functions[c]));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}